

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_WriteAfterReadSentFatalAlert_Test::TestBody
          (SSLVersionTest_WriteAfterReadSentFatalAlert_Test *this)

{
  char cVar1;
  BIO *b;
  internal iVar2;
  bool bVar3;
  int iVar4;
  ParamType *pPVar5;
  UniquePtr<SSL> *pUVar6;
  _Head_base<0UL,_bio_st_*,_false> *p_Var7;
  BIO_METHOD *type;
  BIO *bio;
  long lVar8;
  char *pcVar9;
  pointer __p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *expected_predicate_value;
  pointer *__ptr;
  ScopedTrace gtest_trace_3166;
  uint8_t *unused;
  UniquePtr<BIO> mem;
  UniquePtr<BIO> client_wbio;
  UniquePtr<BIO> server_wbio;
  size_t len;
  char buf [256];
  ScopedTrace local_1c9;
  Message local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  AssertHelper local_1b8;
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  AssertHelper local_190;
  AssertHelper local_188;
  _Head_base<0UL,_bio_st_*,_false> local_180;
  _Head_base<0UL,_bio_st_*,_false> local_178;
  char local_16a [2];
  SSL *local_168;
  _Head_base<0UL,_bio_st_*,_false> local_160;
  UniquePtr<SSL> *local_158;
  UniquePtr<SSL> *local_150;
  long local_148;
  size_t local_140;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type sStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined8 local_e8;
  
  pPVar5 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if (pPVar5->ssl_method != is_dtls) {
    local_128._8_8_ = 0;
    local_118._8_8_ = 0;
    sStack_100 = 0;
    local_f8._8_8_ = 0;
    local_138 = (undefined1  [8])0x0;
    pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_118._M_allocated_capacity = 0;
    local_f8._M_allocated_capacity = 0;
    local_e8._0_4_ = 0;
    local_e8._4_1_ = false;
    local_e8._5_3_ = 0;
    local_150 = &(this->super_SSLVersionTest).client_;
    local_158 = &(this->super_SSLVersionTest).server_;
    bVar3 = (this->super_SSLVersionTest).shed_handshake_config_;
    expected_predicate_value = (char *)(ulong)bVar3;
    local_128._M_allocated_capacity = (size_type)&local_118;
    local_108._M_p = (pointer)&local_f8;
    bVar3 = ConnectClientAndServer
                      (local_150,local_158,
                       (this->super_SSLVersionTest).client_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (this->super_SSLVersionTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (ClientConfig *)local_138,bVar3);
    local_1b0[0] = (internal)bVar3;
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_allocated_capacity != &local_118) {
      operator_delete((void *)local_128._M_allocated_capacity,local_118._M_allocated_capacity + 1);
    }
    iVar2 = local_1b0[0];
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message(&local_1c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_138,(internal *)local_1b0,(AssertionResult *)"Connect()","false",
                 "true",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xc57,(char *)local_138);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_138 != (undefined1  [8])&local_128) {
        operator_delete((void *)local_138,(ulong)(local_128._M_allocated_capacity + 1));
      }
      if ((long *)CONCAT44(local_1c8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_1c8.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_1c8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_1c8.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a8,local_1a8);
    }
    if (iVar2 != (internal)0x0) {
      local_178._M_head_impl =
           (bio_st *)
           SSL_get_wbio((SSL *)(local_150->_M_t).
                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      if ((BIO *)local_178._M_head_impl != (BIO *)0x0) {
        BIO_up_ref(local_178._M_head_impl);
      }
      local_160._M_head_impl =
           (bio_st *)
           SSL_get_wbio((SSL *)(local_158->_M_t).
                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      if ((BIO *)local_160._M_head_impl != (BIO *)0x0) {
        BIO_up_ref(local_160._M_head_impl);
      }
      local_16a[0] = '\0';
      local_16a[1] = '\x01';
      lVar8 = 0;
      do {
        local_148 = lVar8;
        cVar1 = local_16a[lVar8];
        pcVar9 = "client";
        if (cVar1 != '\0') {
          pcVar9 = "server";
        }
        testing::ScopedTrace::ScopedTrace
                  (&local_1c9,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xc5e,pcVar9);
        pUVar6 = local_150;
        if (cVar1 != '\0') {
          pUVar6 = local_158;
        }
        local_168 = (SSL *)(pUVar6->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
        p_Var7 = &local_160;
        if (cVar1 != '\0') {
          p_Var7 = &local_178;
        }
        b = (BIO *)p_Var7->_M_head_impl;
        type = BIO_s_mem();
        bio = BIO_new(type);
        local_1b0[0] = (internal)(bio != (BIO *)0x0);
        local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_180._M_head_impl = (bio_st *)bio;
        if (bio == (BIO *)0x0) {
          testing::Message::Message(&local_1c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_138,(internal *)local_1b0,(AssertionResult *)"mem","false",
                     "true",expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc63,(char *)local_138);
          testing::internal::AssertHelper::operator=(&local_188,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          if (local_138 != (undefined1  [8])&local_128) {
            operator_delete((void *)local_138,(ulong)(local_128._M_allocated_capacity + 1));
          }
          if ((long *)CONCAT44(local_1c8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (int)local_1c8.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1c8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (int)local_1c8.ss_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl) + 8))();
          }
          if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1a8;
            __ptr_00 = local_1a8;
LAB_0017a54c:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(this_00,__ptr_00);
          }
LAB_0017a551:
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_180);
          testing::ScopedTrace::~ScopedTrace(&local_1c9);
          break;
        }
        BIO_up_ref((BIO *)bio);
        local_138 = (undefined1  [8])0x0;
        SSL_set0_wbio((SSL *)local_168,(BIO *)bio);
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)local_138);
        local_1b0._0_4_ = 0xf;
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = BIO_write(b,"invalid record",0xf);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_138,"int{sizeof(kInvalidRecord)}",
                   "BIO_write(other_wbio, kInvalidRecord, sizeof(kInvalidRecord))",(int *)local_1b0,
                   (int *)&local_1c8);
        if (local_138[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_1b0);
          pcVar9 = "";
          if (pbStack_130 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = (pbStack_130->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc69,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1c8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
          if ((long *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + 8))();
          }
        }
        if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_130,pbStack_130);
        }
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0xffffffff;
        local_188.data_._0_4_ = SSL_read(local_168,(internal *)local_138,0x100);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1b0,"-1","SSL_read(ssl, buf, sizeof(buf))",(int *)&local_1c8,
                   (int *)&local_188);
        if (local_1b0[0] == (internal)0x0) {
          testing::Message::Message(&local_1c8);
          pcVar9 = "";
          if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_1a8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc6b,pcVar9);
          testing::internal::AssertHelper::operator=(&local_188,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          if ((long *)CONCAT44(local_1c8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (int)local_1c8.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1c8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (int)local_1c8.ss_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl) + 8))();
          }
        }
        if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a8,local_1a8);
        }
        iVar4 = BIO_mem_contents(local_180._M_head_impl,(uint8_t **)&local_188,&local_140);
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_1c8.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,iVar4 != 0);
        local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1b0,(internal *)&local_1c8,
                     (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc70,(char *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_));
          testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b8);
LAB_0017a507:
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != &local_1a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),
                            local_1a0._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_1b8.data_._4_4_,(int)local_1b8.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1b8.data_._4_4_,(int)local_1b8.data_) + 8))();
          }
          if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1c0;
            __ptr_00 = local_1c0;
            goto LAB_0017a54c;
          }
          goto LAB_0017a551;
        }
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
                  ((internal *)local_1b0,"0u","len",(uint *)&local_1c8,&local_140);
        if (local_1b0[0] == (internal)0x0) {
          testing::Message::Message(&local_1c8);
          pcVar9 = "";
          if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_1a8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc71,pcVar9);
          testing::internal::AssertHelper::operator=(&local_1b8,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_1b8);
          if ((long *)CONCAT44(local_1c8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (int)local_1c8.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1c8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (int)local_1c8.ss_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl) + 8))();
          }
        }
        if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a8,local_1a8);
        }
        iVar4 = BIO_reset(local_180._M_head_impl);
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_1c8.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,iVar4 != 0);
        local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1b0,(internal *)&local_1c8,
                     (AssertionResult *)"BIO_reset(mem.get())","false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc72,(char *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_));
          testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b8);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != &local_1a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),
                            local_1a0._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_1b8.data_._4_4_,(int)local_1b8.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1b8.data_._4_4_,(int)local_1b8.data_) + 8))();
          }
          if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_1c0,local_1c0);
          }
        }
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0xffffffff;
        local_1b8.data_._0_4_ = SSL_write(local_168,"a",1);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1b0,"-1","SSL_write(ssl, \"a\", 1)",(int *)&local_1c8,
                   (int *)&local_1b8);
        if (local_1b0[0] == (internal)0x0) {
          testing::Message::Message(&local_1c8);
          pcVar9 = "";
          if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_1a8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc75,pcVar9);
          testing::internal::AssertHelper::operator=(&local_1b8,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_1b8);
          if ((long *)CONCAT44(local_1c8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (int)local_1c8.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1c8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (int)local_1c8.ss_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl) + 8))();
          }
        }
        if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a8,local_1a8);
        }
        iVar4 = BIO_mem_contents(local_180._M_head_impl,(uint8_t **)&local_188,&local_140);
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_1c8.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,iVar4 != 0);
        local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1b0,(internal *)&local_1c8,
                     (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc78,(char *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_));
          testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b8);
          goto LAB_0017a507;
        }
        local_1c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_1b0,"0u","len",(uint *)&local_1c8,&local_140);
        if (local_1b0[0] == (internal)0x0) {
          testing::Message::Message(&local_1c8);
          pcVar9 = "";
          if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_1a8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc79,pcVar9);
          testing::internal::AssertHelper::operator=(&local_1b8,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_1b8);
          if ((long *)CONCAT44(local_1c8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (int)local_1c8.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1c8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (int)local_1c8.ss_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl) + 8))();
          }
        }
        if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a8,local_1a8);
        }
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_180);
        testing::ScopedTrace::~ScopedTrace(&local_1c9);
        lVar8 = local_148 + 1;
      } while (lVar8 != 2);
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_160);
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_178);
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, WriteAfterReadSentFatalAlert) {
  // Decryption failures are not fatal in DTLS.
  if (is_dtls()) {
    return;
  }

  ASSERT_TRUE(Connect());

  // Save the write |BIO|s as the test will overwrite them.
  bssl::UniquePtr<BIO> client_wbio = bssl::UpRef(SSL_get_wbio(client_.get()));
  bssl::UniquePtr<BIO> server_wbio = bssl::UpRef(SSL_get_wbio(server_.get()));

  for (bool test_server : {false, true}) {
    SCOPED_TRACE(test_server ? "server" : "client");
    SSL *ssl = test_server ? server_.get() : client_.get();
    BIO *other_wbio = test_server ? client_wbio.get() : server_wbio.get();

    bssl::UniquePtr<BIO> mem(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(mem);
    SSL_set0_wbio(ssl, bssl::UpRef(mem).release());

    // Read an invalid record from the peer.
    static const uint8_t kInvalidRecord[] = "invalid record";
    EXPECT_EQ(int{sizeof(kInvalidRecord)},
              BIO_write(other_wbio, kInvalidRecord, sizeof(kInvalidRecord)));
    char buf[256];
    EXPECT_EQ(-1, SSL_read(ssl, buf, sizeof(buf)));

    // |ssl| should have written an alert to the transport.
    const uint8_t *unused;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_NE(0u, len);
    EXPECT_TRUE(BIO_reset(mem.get()));

    // Writing should fail.
    EXPECT_EQ(-1, SSL_write(ssl, "a", 1));

    // Nothing should be written to the transport.
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_EQ(0u, len);
  }
}